

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

void __thiscall
clipp::usage_lines::start_group(usage_lines *this,ostringstream *os,group *group,context *cur)

{
  group *pgVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  child_t<clipp::parameter,_clipp::group> *pcVar5;
  long lVar6;
  doc_formatting *fmt;
  ulong uVar7;
  __string_type pfx;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  string lbl;
  string local_2a8;
  stringstream buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [11];
  context local_100;
  
  pgVar1 = (cur->pos).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].parent;
  joined_label_abi_cxx11_(&lbl,this,group,cur);
  if (lbl._M_string_length == 0) {
    if ((group->exclusive_ == true) && ((this->fmt_).splitTopAlt_ == true)) {
      bVar3 = std::
              any_of<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,clipp::usage_lines::start_group(std::__cxx11::ostringstream&,clipp::group_const&,clipp::usage_lines::context&)const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>
                        ((group->children_).
                         super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (group->children_).
                         super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (anon_class_8_1_8991fb9c_for__M_pred)this);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"",(allocator<char> *)&pfx);
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &cur->postfixes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf);
        std::__cxx11::string::~string((string *)&buf);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"",(allocator<char> *)&pfx);
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &cur->separators,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf);
        std::__cxx11::string::~string((string *)&buf);
        if (pgVar1 != group) {
          clipp::group::depth_first_traverser::operator++(&cur->pos);
        }
        cur->linestart = true;
        cur->useOutermost = false;
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buf,"",(allocator<char> *)local_2e8);
        std::__cxx11::stringbuf::str((string *)(os + 8));
        std::__cxx11::string::~string((string *)&buf);
        for (uVar7 = 0;
            uVar7 < (ulong)(((long)(group->children_).
                                   super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(group->children_).
                                  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x108);
            uVar7 = uVar7 + 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&buf);
          pcVar5 = (cur->pos).stack_.
                   super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
          if (pcVar5->type_ != group) {
            pcVar5 = (child_t<clipp::parameter,_clipp::group> *)0x0;
          }
          cur->outermost = (group *)pcVar5;
          context::context(&local_100,cur);
          std::__cxx11::string::string((string *)&local_2a8,(string *)&pfx);
          write<std::__cxx11::stringstream>(this,&buf,&local_100,&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          context::~context(&local_100);
          lVar6 = std::ostream::tellp();
          if ((int)pfx._M_string_length < lVar6) {
            std::__cxx11::stringbuf::str();
            std::operator<<((ostream *)os,(string *)local_2e8);
            std::__cxx11::string::~string((string *)local_2e8);
            if (uVar7 < ((long)(group->children_).
                               super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(group->children_).
                              super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x108 - 1U) {
              iVar4 = cur->line;
              if (0 < iVar4) {
                local_2e8[0] = local_2d8;
                std::__cxx11::string::_M_construct((ulong)local_2e8,(char)(this->fmt_).lineSpc_);
                std::operator<<((ostream *)os,(string *)local_2e8);
                std::__cxx11::string::~string((string *)local_2e8);
                iVar4 = cur->line;
              }
              cur->line = iVar4 + 1;
              std::operator<<((ostream *)os,'\n');
            }
          }
          clipp::group::depth_first_traverser::next_sibling(&cur->pos);
          std::__cxx11::stringstream::~stringstream((stringstream *)&buf);
        }
        pcVar2 = (cur->pos).stack_.
                 super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((cur->pos).stack_.
            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
            ._M_impl.super__Vector_impl_data._M_finish != pcVar2) {
          (cur->pos).stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_finish = pcVar2;
        }
        std::__cxx11::string::~string((string *)&pfx);
        goto LAB_0010f770;
      }
    }
    fmt = (doc_formatting *)cur;
    group_surrounders_abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&buf,this,group,cur);
    std::operator<<((ostream *)os,(string *)&buf);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cur->postfixes,
               local_268);
    group_separator_abi_cxx11_(&pfx,(usage_lines *)group,(group *)&this->fmt_,fmt);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cur->separators,
               &pfx);
    std::__cxx11::string::~string((string *)&pfx);
    if (pgVar1 != group) {
      clipp::group::depth_first_traverser::operator++(&cur->pos);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&buf);
  }
  else {
    std::operator<<((ostream *)os,(string *)&lbl);
    cur->linestart = false;
    if (pgVar1 == group) {
      clipp::group::depth_first_traverser::next_after_siblings(&cur->pos);
    }
    else {
      clipp::group::depth_first_traverser::next_sibling(&cur->pos);
    }
  }
  cur->level = (int)(((long)(cur->pos).stack_.
                            super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(cur->pos).stack_.
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18);
LAB_0010f770:
  std::__cxx11::string::~string((string *)&lbl);
  return;
}

Assistant:

void start_group(std::ostringstream& os,
                     const group& group, context& cur) const
    {
        //does cur.pos already point to a member or to group itself?
        //needed for special treatment of outermost group
        const bool alreadyInside = &(cur.pos.parent()) == &group;

        auto lbl = joined_label(group, cur);
        if(!lbl.empty()) {
            os << lbl;
            cur.linestart = false;
            //skip over entire group as its label has already been created
            if(alreadyInside) {
                cur.pos.next_after_siblings();
            } else {
                cur.pos.next_sibling();
            }
        }
        else {
            const bool splitAlternatives = group.exclusive() &&
                fmt_.split_alternatives() &&
                std::any_of(group.begin(), group.end(),
                    [this](const pattern& p) {
                        return int(p.param_count()) >= fmt_.alternatives_min_split_size();
                    });

            if(splitAlternatives) {
                cur.postfixes.push("");
                cur.separators.push("");
                //recursively print alternative paths in decision-DAG
                //enter group?
                if(!alreadyInside) ++cur.pos;
                cur.linestart = true;
                cur.useOutermost = false;
                auto pfx = os.str();
                os.str("");
                //print paths in DAG starting at each group member
                for(std::size_t i = 0; i < group.size(); ++i) {
                    std::stringstream buf;
                    cur.outermost = cur.pos->is_group() ? &(cur.pos->as_group()) : nullptr;
                    write(buf, cur, pfx);
                    if(buf.tellp() > int(pfx.size())) {
                        os << buf.str();
                        if(i < group.size()-1) {
                            if(cur.line > 0) {
                                os << string(fmt_.line_spacing(), '\n');
                            }
                            ++cur.line;
                            os << '\n';
                        }
                    }
                    cur.pos.next_sibling(); //do not descend into members
                }
                cur.pos.invalidate(); //signal end-of-path
                return;
            }
            else {
                //pre & postfixes, separators
                auto surround = group_surrounders(group, cur);
                os << surround.first;
                cur.postfixes.push(std::move(surround.second));
                cur.separators.push(group_separator(group, fmt_));
                //descend into group?
                if(!alreadyInside) ++cur.pos;
            }
        }
        cur.level = cur.pos.level();
    }